

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O3

void kv_ins_var_nentry_test(void)

{
  uint64_t uVar1;
  bool bVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  size_t sVar6;
  ushort *puVar7;
  bnode *pbVar8;
  btree_kv_ops *pbVar9;
  long lVar10;
  __suseconds_t *p_Var11;
  bool bVar12;
  ulong __n;
  undefined2 *__ptr;
  char cVar13;
  undefined1 *puVar14;
  char *pcVar15;
  long lStack_188;
  long lStack_180;
  timeval tStack_178;
  btree bStack_168;
  btree_kv_ops *pbStack_130;
  __suseconds_t *p_Stack_128;
  undefined2 *puStack_120;
  code *pcStack_118;
  undefined2 *puStack_110;
  undefined2 *puStack_108;
  timeval tStack_100;
  bnode *pbStack_f0;
  uint64_t uStack_e8;
  code *pcStack_e0;
  btree_kv_ops local_d8;
  undefined8 uStack_60;
  undefined1 local_58 [8];
  timeval __test_begin;
  __suseconds_t local_40;
  char local_31 [8];
  uint8_t v;
  undefined7 uVar16;
  
  puVar14 = local_58;
  lVar10 = 0;
  uStack_60 = 0x103886;
  gettimeofday((timeval *)local_58,(__timezone_ptr_t)0x0);
  uStack_60 = 0x10388b;
  memleak_start();
  p_Var11 = &__test_begin.tv_usec;
  bVar2 = true;
  do {
    bVar12 = bVar2;
    pcVar15 = (char *)(&DAT_00109d60)[lVar10];
    uStack_60 = 0x1038a5;
    sVar6 = strlen(pcVar15);
    uVar4 = (int)sVar6 + 1;
    __n = (ulong)(uVar4 & 0xffff);
    uStack_60 = 0x1038b4;
    puVar7 = (ushort *)malloc(__n + 2);
    uVar3 = (ushort)uVar4;
    *puVar7 = uVar3 << 8 | uVar3 >> 8;
    uStack_60 = 0x1038d1;
    memcpy(puVar7 + 1,pcVar15,__n);
    *p_Var11 = (__suseconds_t)puVar7;
    lVar10 = 1;
    p_Var11 = &local_40;
    bVar2 = false;
  } while (bVar12);
  uStack_60 = 0x1038f4;
  pbVar8 = (bnode *)malloc(0x1010);
  pbVar8->kvsize = 0x901;
  pbVar8->flag = 0;
  pbVar8->level = 1;
  pbVar8->nentry = 2;
  (pbVar8->field_4).data = pbVar8 + 1;
  local_31[0] = 'd';
  pcStack_e0 = (code *)0x103923;
  btree_str_kv_get_kb64_vb64(&local_d8);
  pcStack_e0 = (code *)0x103933;
  (*local_d8.ins_kv)(pbVar8,0,&__test_begin.tv_usec,local_31);
  local_31[0] = local_31[0] + '\x01';
  pcStack_e0 = (code *)0x103946;
  (*local_d8.ins_kv)(pbVar8,0,&local_40,local_31);
  uVar1 = (pbVar8->field_4).dummy;
  pcStack_e0 = (code *)0x10395a;
  iVar5 = strcmp((char *)(uVar1 + 2),"longstring");
  if (iVar5 == 0) {
    cVar13 = *(char *)(uVar1 + 0xd);
    uVar16 = (undefined7)((ulong)local_58 >> 8);
    puVar14 = (undefined1 *)CONCAT71(uVar16,cVar13);
    if (cVar13 != local_31[0]) goto LAB_001039b1;
    cVar13 = cVar13 + -1;
    puVar14 = (undefined1 *)CONCAT71(uVar16,cVar13);
    pcStack_e0 = (code *)0x10397f;
    local_31[0] = cVar13;
    iVar5 = strcmp((char *)(uVar1 + 0x10),"string");
    if (iVar5 == 0) {
      if (*(char *)(uVar1 + 0x17) == cVar13) {
        pcStack_e0 = (code *)0x10399d;
        kv_ins_var_nentry_test();
        return;
      }
      goto LAB_001039bb;
    }
  }
  else {
    pcStack_e0 = (code *)0x1039b1;
    kv_ins_var_nentry_test();
LAB_001039b1:
    pcStack_e0 = (code *)0x1039b6;
    kv_ins_var_nentry_test();
  }
  pcStack_e0 = (code *)0x1039bb;
  kv_ins_var_nentry_test();
LAB_001039bb:
  pcStack_e0 = kv_set_str_key_test;
  kv_ins_var_nentry_test();
  pcStack_118 = (code *)0x1039d5;
  pbStack_f0 = pbVar8;
  uStack_e8 = uVar1;
  pcStack_e0 = (code *)puVar14;
  gettimeofday(&tStack_100,(__timezone_ptr_t)0x0);
  pcStack_118 = (code *)0x1039da;
  memleak_start();
  puStack_110 = (undefined2 *)0x0;
  pcStack_118 = (code *)0x1039eb;
  pbVar9 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  pcStack_118 = (code *)0x1039f8;
  puStack_108 = (undefined2 *)malloc(0xd);
  *puStack_108 = 0xb00;
  *(undefined8 *)(puStack_108 + 1) = 0x6972747374736574;
  *(undefined4 *)((long)puStack_108 + 9) = 0x676e69;
  pcVar15 = "teststring";
  pcStack_118 = (code *)0x103a29;
  (*pbVar9->set_key)((btree *)0x0,&puStack_110,&puStack_108);
  __ptr = puStack_110;
  pcStack_118 = (code *)0x103a38;
  iVar5 = strcmp((char *)(puStack_110 + 1),"teststring");
  if (iVar5 == 0) {
    pcStack_118 = (code *)0x103a48;
    free(__ptr);
    pcStack_118 = (code *)0x103a52;
    puStack_110 = (undefined2 *)malloc(0x15);
    *puStack_110 = 0x1300;
    pcVar15 = (char *)(puStack_110 + 1);
    pcVar15[0] = 'u';
    pcVar15[1] = 'p';
    pcVar15[2] = 'd';
    pcVar15[3] = 'a';
    pcVar15[4] = 't';
    pcVar15[5] = 'e';
    pcVar15[6] = 'd';
    pcVar15[7] = ' ';
    pcVar15 = (char *)(puStack_110 + 5);
    pcVar15[0] = 't';
    pcVar15[1] = 'e';
    pcVar15[2] = 's';
    pcVar15[3] = 't';
    pcVar15[4] = 's';
    pcVar15[5] = 't';
    pcVar15[6] = 'r';
    pcVar15[7] = 'i';
    *(undefined4 *)((long)puStack_110 + 0x11) = 0x676e69;
    pcVar15 = "updated teststring";
    pcStack_118 = (code *)0x103a83;
    (*pbVar9->set_key)((btree *)0x0,&puStack_108,&puStack_110);
    __ptr = puStack_108;
    pcStack_118 = (code *)0x103a92;
    iVar5 = strcmp((char *)(puStack_108 + 1),"updated teststring");
    if (iVar5 == 0) {
      pcStack_118 = (code *)0x103a9e;
      free(pbVar9);
      pcStack_118 = (code *)0x103aa6;
      free(__ptr);
      pcStack_118 = (code *)0x103aaf;
      free(puStack_110);
      pcStack_118 = (code *)0x103ab4;
      memleak_end();
      pcVar15 = "%s PASSED\n";
      if (kv_set_str_key_test()::__test_pass != '\0') {
        pcVar15 = "%s FAILED\n";
      }
      pcStack_118 = (code *)0x103ae5;
      fprintf(_stderr,pcVar15,"kv_set_str_key_test");
      return;
    }
  }
  else {
    pcStack_118 = (code *)0x103af4;
    kv_set_str_key_test();
  }
  pcStack_118 = kv_set_str_value_test;
  kv_set_str_key_test();
  pbStack_130 = pbVar9;
  p_Stack_128 = p_Var11;
  puStack_120 = __ptr;
  pcStack_118 = (code *)pcVar15;
  gettimeofday(&tStack_178,(__timezone_ptr_t)0x0);
  memleak_start();
  lStack_188 = 100;
  bStack_168.vsize = '\b';
  pbVar9 = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  (*pbVar9->set_value)(&bStack_168,&lStack_188,&lStack_180);
  if (lStack_188 != lStack_180) {
    kv_set_str_value_test();
  }
  lStack_180 = 200;
  (*pbVar9->set_value)(&bStack_168,&lStack_180,&lStack_188);
  if (lStack_188 != lStack_180) {
    kv_set_str_value_test();
  }
  free(pbVar9);
  memleak_end();
  pcVar15 = "%s PASSED\n";
  if (kv_set_str_value_test()::__test_pass != '\0') {
    pcVar15 = "%s FAILED\n";
  }
  fprintf(_stderr,pcVar15,"kv_set_str_value_test");
  return;
}

Assistant:

void kv_ins_var_nentry_test()
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    btree_kv_ops *kv_ops;
    uint8_t ksize, vsize;
    uint8_t v;
    idx_t idx;
    int cmp, i, offset;
    char *node_str;

    const char *keys[] = {"string",
                          "longstring"};

    int n =  sizeof(keys)/sizeof(void *);
    void **key_ptrs = alca(void *, n);

    for (i = 0; i < n; i++) {
        construct_key_ptr(keys[i], strlen(keys[i]) + 1, &key_ptrs[i]);
    }

    ksize = strlen(keys[0]) + 1 + sizeof(key_len_t);
    vsize = sizeof(v);
    node = dummy_node(ksize, vsize, 1);
    node->nentry = n;

    idx = 0;
    v = 100;
    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);

    // insert twice at beginning of node
    kv_ops->ins_kv(node, 0, &key_ptrs[idx], (void *)&v);
    idx++;
    v++;
    kv_ops->ins_kv(node, 0, &key_ptrs[idx], (void *)&(v));

    // verify k1 is at entry 0
    offset = sizeof(key_len_t);
    node_str = (char *)((uint8_t *)node->data + offset);
    cmp = strcmp(node_str, keys[1]);
    TEST_CHK(cmp == 0);
    offset += strlen(keys[1]) + 1;
    cmp = memcmp((uint8_t *)node->data + offset, &v, vsize);
    TEST_CHK(cmp == 0);

    v--;
    // verify k0 is at entry 1
    offset += vsize + sizeof(key_len_t);
    node_str = (char *)((uint8_t *)node->data + offset);
    cmp = strcmp(node_str, keys[0]);
    TEST_CHK(cmp == 0);
    offset += strlen(keys[0]) + 1;
    cmp = memcmp((uint8_t *)node->data + offset, &v, vsize);
    TEST_CHK(cmp == 0);

    free(node);
    freevars(key_ptrs, n);
    memleak_end();

    TEST_RESULT("kv_ins_var_nentry_test");
}